

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppMod(word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  size_t sVar1;
  size_t sVar2;
  word *stack_00;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  word *in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  ulong in_R8;
  word *in_R9;
  word *w2;
  word *w1;
  word *divisor;
  word *divident;
  size_t i;
  size_t shift;
  word tmp;
  word dividentHi;
  size_t in_stack_ffffffffffffff88;
  word *in_stack_ffffffffffffff90;
  word *a_00;
  word *n_00;
  word *b_00;
  ulong local_50;
  size_t local_28;
  
  sVar1 = wwBitSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar2 = wwBitSize(in_stack_ffffffffffffff90,sVar1);
  local_28 = in_R8;
  if (sVar1 < sVar2) {
    if (in_RDX < in_R8) {
      wwSetZero(in_RDI + in_RDX,in_R8 - in_RDX);
      local_28 = in_RDX;
    }
    wwCopy(in_RDI,in_RSI,local_28);
  }
  else {
    b_00 = in_R9 + in_RDX + 1;
    n_00 = b_00 + in_R8;
    a_00 = n_00 + 0x10;
    stack_00 = n_00 + 0x20;
    wwCopy(in_R9,in_RSI,in_RDX);
    in_R9[in_RDX] = 0;
    wwCopy(b_00,in_RCX,in_R8);
    sVar1 = wwBitSize(a_00,sVar1);
    if ((sVar1 - 1 & 0x3f) == 0) {
      local_28 = in_R8 - 1;
      in_RDI[in_R8 - 1] = 0;
    }
    else {
      wwShHi(b_00,(size_t)n_00,(size_t)a_00);
      wwShHi(b_00,(size_t)n_00,(size_t)a_00);
    }
    *n_00 = 0;
    n_00[1] = 1;
    n_00[2] = n_00[-((long)b_00[local_28 - 1] >> 0x3f)] ^ 2;
    n_00[3] = n_00[b_00[local_28 - 1] >> 0x3f ^ 1] ^ 2;
    n_00[4] = n_00[b_00[local_28 - 1] >> 0x3e] ^ 4;
    n_00[5] = n_00[b_00[local_28 - 1] >> 0x3e ^ 1] ^ 4;
    n_00[6] = n_00[b_00[local_28 - 1] >> 0x3e ^ 2] ^ 4;
    n_00[7] = n_00[b_00[local_28 - 1] >> 0x3e ^ 3] ^ 4;
    n_00[8] = n_00[b_00[local_28 - 1] >> 0x3d] ^ 8;
    n_00[9] = n_00[b_00[local_28 - 1] >> 0x3d ^ 1] ^ 8;
    n_00[10] = n_00[b_00[local_28 - 1] >> 0x3d ^ 2] ^ 8;
    n_00[0xb] = n_00[b_00[local_28 - 1] >> 0x3d ^ 3] ^ 8;
    n_00[0xc] = n_00[b_00[local_28 - 1] >> 0x3d ^ 4] ^ 8;
    n_00[0xd] = n_00[b_00[local_28 - 1] >> 0x3d ^ 5] ^ 8;
    n_00[0xe] = n_00[b_00[local_28 - 1] >> 0x3d ^ 6] ^ 8;
    n_00[0xf] = n_00[b_00[local_28 - 1] >> 0x3d ^ 7] ^ 8;
    *a_00 = 0;
    a_00[1] = b_00[local_28 - 1];
    a_00[2] = a_00[1] << 1;
    a_00[3] = a_00[2] ^ b_00[local_28 - 1];
    a_00[4] = a_00[2] << 1;
    a_00[5] = a_00[4] ^ b_00[local_28 - 1];
    a_00[6] = a_00[3] << 1;
    a_00[7] = a_00[6] ^ b_00[local_28 - 1];
    a_00[8] = a_00[4] << 1;
    a_00[9] = a_00[8] ^ b_00[local_28 - 1];
    a_00[10] = a_00[5] << 1;
    a_00[0xb] = a_00[10] ^ b_00[local_28 - 1];
    a_00[0xc] = a_00[6] << 1;
    a_00[0xd] = a_00[0xc] ^ b_00[local_28 - 1];
    a_00[0xe] = a_00[7] << 1;
    a_00[0xf] = a_00[0xe] ^ b_00[local_28 - 1];
    for (local_50 = in_RDX; local_28 <= local_50; local_50 = local_50 - 1) {
      uVar3 = a_00[n_00[in_R9[local_50] >> 0x3c] & 0xf] >> 4 ^ in_R9[local_50];
      uVar4 = n_00[in_R9[local_50] >> 0x3c] << 4 ^ n_00[uVar3 >> 0x38 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 8 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x34 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0xc ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x30 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x10 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x2c & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x14 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x28 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x18 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x24 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x1c ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x20 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x20 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x1c & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x24 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x18 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x28 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x14 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x2c ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0x10 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x30 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 0xc & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x34 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 8 & 0xf];
      uVar3 = a_00[uVar4 & 0xf] >> 0x38 ^ uVar3;
      uVar4 = uVar4 << 4 ^ n_00[uVar3 >> 4 & 0xf];
      uVar4 = uVar4 << 4 ^ n_00[(a_00[uVar4 & 0xf] >> 0x3c ^ uVar3) & 0xf];
      wVar5 = ppAddMulW(in_R9 + (local_50 - local_28),b_00,local_28,uVar4,stack_00);
      in_R9[local_50] = wVar5 ^ in_R9[local_50];
      in_R9[local_50] = uVar4 ^ in_R9[local_50];
    }
    wwShLo(b_00,(size_t)n_00,(size_t)a_00);
    wwCopy(in_RDI,in_R9,local_28);
  }
  return;
}

Assistant:

void ppMod(word r[], const word a[], size_t n, const word b[], size_t m,
	void* stack)
{
	register word dividentHi;
	register word tmp;
	register size_t shift;
	size_t i;
	// переменные в stack
	word* divident;		/* нормализованное делимое (n + 1 слово) */
	word* divisor;		/* нормализованный делитель (m слов) */
	word* w1;			/* таблица частных (16 слов) */
	word* w2;			/* таблица умножения (16 слов) */
	// pre
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// deg(a) < deg(b)?
	if (wwBitSize(a, n) < wwBitSize(b, m))
	{
		// r <- a
		if (n < m)
			wwSetZero(r + n, m - n), m = n;
		wwCopy(r, a, m);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	w1 = divisor + m;
	w2 = w1 + 16;
	stack = w2 + 16;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация -- сделать старший разряд divisor первым в старшем
	// (возможно неявном) слове
	shift = (wwBitSize(b + m - 1, 1) - 1) % B_PER_W;
	// нормализация не нужна?
	if (shift == 0)
		// обнуляем старшее слово r
		r[--m] = 0;
	else
		// сдвигаем divisor и divident
		shift = B_PER_W - shift,
		wwShHi(divident, n + 1, shift),
		wwShHi(divisor, m, shift);
	// строим таблицы
	_DIV_PRE_S4(w1, divisor[m - 1]);
	_MUL_PRE_S4(w2, divisor[m - 1]);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// tmp <- divident[i] \div (1, divisor[m - 1])
		dividentHi = divident[i];
		_DIV_DIV_S4(dividentHi, tmp, w1, w2);
		// divident <- divident - divisor * X^{i - m} * tmp
		divident[i] ^=
			ppAddMulW(divident + i - m, divisor, m, tmp, stack);
		// обработаем неявный старший разряд divisor
		divident[i] ^= tmp;
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	shift = 0;
	tmp = 0;
	dividentHi = 0;
}